

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O2

string * __thiscall
cmLinkLineDeviceComputer::ComputeLinkLibraries
          (string *__return_storage_ptr__,cmLinkLineDeviceComputer *this,
          cmComputeLinkInformation *cli,string *stdLibString)

{
  pointer pIVar1;
  cmGeneratorTarget *this_00;
  bool bVar2;
  bool bVar3;
  TargetType TVar4;
  ItemVector *pIVar5;
  ostream *poVar6;
  pointer __lhs;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar7;
  string out;
  string config;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  ostringstream fout;
  string local_258;
  string local_238 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  string local_1e8;
  string local_1c8;
  ostream local_1a8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  local_218._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_218._M_impl.super__Rb_tree_header._M_header;
  local_218._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_218._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_218._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_218._M_impl.super__Rb_tree_header._M_header._M_right =
       local_218._M_impl.super__Rb_tree_header._M_header._M_left;
  pIVar5 = cmComputeLinkInformation::GetItems(cli);
  std::__cxx11::string::string(local_238,(string *)&cli->Config);
  __lhs = (pIVar5->
          super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (pIVar5->
           super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar2 = false;
  do {
    if (__lhs == pIVar1) {
      if (stdLibString->_M_string_length != 0) {
        poVar6 = std::operator<<(&local_1a8,(string *)stdLibString);
        std::operator<<(poVar6," ");
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::~string(local_238);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_218);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      return __return_storage_ptr__;
    }
    if (bVar2) {
LAB_00312606:
      bVar2 = false;
    }
    else {
      if (__lhs->Target != (cmGeneratorTarget *)0x0) {
        TVar4 = cmGeneratorTarget::GetType(__lhs->Target);
        if (TVar4 == STATIC_LIBRARY) {
          this_00 = __lhs->Target;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_258,"CUDA_RESOLVE_DEVICE_SYMBOLS",
                     (allocator<char> *)&local_1c8);
          bVar2 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_258);
          std::__cxx11::string::~string((string *)&local_258);
          if (bVar2) goto LAB_00312606;
        }
        else {
          bVar2 = false;
          if ((TVar4 == MODULE_LIBRARY) || (TVar4 == INTERFACE_LIBRARY)) goto LAB_003127a0;
        }
      }
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      local_258._M_string_length = 0;
      local_258.field_2._M_local_buf[0] = '\0';
      if (__lhs->IsPath == true) {
        bVar2 = cmHasLiteralSuffix<std::__cxx11::string,3ul>(&__lhs->Value,(char (*) [3])0x482281);
        if ((bVar2) ||
           (bVar2 = cmHasLiteralSuffix<std::__cxx11::string,5ul>(&__lhs->Value,(char (*) [5])".lib")
           , bVar2)) {
          (*(this->super_cmLinkLineComputer)._vptr_cmLinkLineComputer[2])(&local_1e8,this,__lhs);
          cmLinkLineComputer::ConvertToOutputFormat
                    (&local_1c8,&this->super_cmLinkLineComputer,&local_1e8);
          std::__cxx11::string::append((string *)&local_258);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::string::~string((string *)&local_1e8);
        }
LAB_00312764:
        pVar7 = std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_218,&local_258);
        if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          poVar6 = std::operator<<(&local_1a8,(string *)&local_258);
          std::operator<<(poVar6," ");
        }
        bVar2 = false;
      }
      else {
        bVar3 = std::operator==(&__lhs->Value,"-framework");
        bVar2 = true;
        if (!bVar3) {
          bVar2 = cmHasLiteralPrefix<std::__cxx11::string,2ul>(&__lhs->Value,(char (*) [2])0x4721c7)
          ;
          if ((((!bVar2) ||
               (bVar2 = cmHasLiteralPrefix<std::__cxx11::string,3ul>
                                  (&__lhs->Value,(char (*) [3])0x47c345), bVar2)) ||
              (bVar2 = cmHasLiteralPrefix<std::__cxx11::string,3ul>
                                 (&__lhs->Value,(char (*) [3])"-L"), bVar2)) ||
             (bVar2 = cmHasLiteralPrefix<std::__cxx11::string,10ul>
                                (&__lhs->Value,(char (*) [10])"--library"), bVar2)) {
            std::__cxx11::string::append((string *)&local_258);
          }
          goto LAB_00312764;
        }
      }
      std::__cxx11::string::~string((string *)&local_258);
    }
LAB_003127a0:
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

std::string cmLinkLineDeviceComputer::ComputeLinkLibraries(
  cmComputeLinkInformation& cli, std::string const& stdLibString)
{
  // Write the library flags to the build rule.
  std::ostringstream fout;

  // Generate the unique set of link items when device linking.
  // The nvcc device linker is designed so that each static library
  // with device symbols only needs to be listed once as it doesn't
  // care about link order.
  std::set<std::string> emitted;
  typedef cmComputeLinkInformation::ItemVector ItemVector;
  ItemVector const& items = cli.GetItems();
  std::string config = cli.GetConfig();
  bool skipItemAfterFramework = false;
  for (auto const& item : items) {
    if (skipItemAfterFramework) {
      skipItemAfterFramework = false;
      continue;
    }

    if (item.Target) {
      bool skip = false;
      switch (item.Target->GetType()) {
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::INTERFACE_LIBRARY:
          skip = true;
          break;
        case cmStateEnums::STATIC_LIBRARY:
          skip = item.Target->GetPropertyAsBool("CUDA_RESOLVE_DEVICE_SYMBOLS");
          break;
        default:
          break;
      }
      if (skip) {
        continue;
      }
    }

    std::string out;
    if (item.IsPath) {
      // nvcc understands absolute paths to libraries ending in '.a' or '.lib'.
      // These should be passed to nvlink.  Other extensions need to be left
      // out because nvlink may not understand or need them.  Even though it
      // can tolerate '.so' or '.dylib' it cannot tolerate '.so.1'.
      if (cmHasLiteralSuffix(item.Value, ".a") ||
          cmHasLiteralSuffix(item.Value, ".lib")) {
        out += this->ConvertToOutputFormat(
          this->ConvertToLinkReference(item.Value));
      }
    } else if (item.Value == "-framework") {
      // This is the first part of '-framework Name' where the framework
      // name is specified as a following item.  Ignore both.
      skipItemAfterFramework = true;
      continue;
    } else if (cmLinkItemValidForDevice(item.Value)) {
      out += item.Value;
    }

    if (emitted.insert(out).second) {
      fout << out << " ";
    }
  }

  if (!stdLibString.empty()) {
    fout << stdLibString << " ";
  }

  return fout.str();
}